

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 soft_f64_addsub(float64 a,float64 b,_Bool subtract,float_status *status)

{
  long lVar1;
  uint uVar2;
  FloatClass FVar3;
  FloatClass FVar4;
  FloatParts FVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint64_t uVar14;
  ulong uVar15;
  FloatParts part;
  FloatParts FVar16;
  FloatParts FVar17;
  
  FVar17._8_8_ = a >> 0x34 & 0x7ff | a >> 0x17 & 0x10000000000;
  FVar17.frac = a & 0xfffffffffffff;
  FVar16 = sf_canonicalize(FVar17,&float64_params,status);
  uVar15 = FVar16._8_8_;
  uVar10 = FVar16.frac;
  part.frac = b & 0xfffffffffffff;
  part._8_8_ = b >> 0x34 & 0x7ff | b >> 0x17 & 0x10000000000;
  FVar17 = sf_canonicalize(part,&float64_params,status);
  uVar12 = FVar17._8_8_;
  uVar9 = FVar17.frac;
  uVar2 = FVar16._12_4_;
  uVar13 = uVar2 >> 8;
  FVar3 = FVar16.cls;
  FVar4 = FVar17.cls;
  iVar8 = FVar16.exp;
  iVar11 = FVar17.exp;
  if (FVar16.sign == (FVar17.sign != subtract)) {
    if (FVar4 == float_class_normal && FVar3 == float_class_normal) {
      iVar7 = iVar8 - iVar11;
      FVar5 = FVar16;
      if (iVar7 == 0 || iVar8 < iVar11) {
        if (iVar8 < iVar11) {
          if (iVar11 - iVar8 < 0x40) {
            bVar6 = (byte)(iVar11 - iVar8);
            uVar10 = (ulong)(uVar10 << (-bVar6 & 0x3f) != 0) | uVar10 >> (bVar6 & 0x3f);
          }
          else {
            uVar10 = (ulong)(uVar10 != 0);
          }
          uVar15 = uVar15 & 0xffffffff00000000 | uVar12 & 0xffffffff;
          FVar5.exp = (int)uVar15;
          FVar5.cls = (char)(uVar15 >> 0x20);
          FVar5.sign = (_Bool)(char)(uVar15 >> 0x28);
          FVar5._14_2_ = (short)(uVar15 >> 0x30);
          FVar5.frac = uVar10;
        }
      }
      else if (iVar7 < 0x40) {
        uVar9 = (ulong)(uVar9 << (-(byte)iVar7 & 0x3f) != 0) | uVar9 >> ((byte)iVar7 & 0x3f);
      }
      else {
        uVar9 = (ulong)(uVar9 != 0);
      }
      uVar10 = FVar5._8_8_;
      uVar9 = FVar5.frac + uVar9;
      FVar16.exp = (int)uVar10;
      FVar16.cls = (char)(uVar10 >> 0x20);
      FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
      FVar16._14_2_ = (short)(uVar10 >> 0x30);
      FVar16.frac = uVar9;
      if ((long)uVar9 < 0) {
        uVar10 = uVar10 & 0xffffffff00000000 | (ulong)(FVar5.exp + 1);
        FVar16.exp = (int)uVar10;
        FVar16.cls = (char)(uVar10 >> 0x20);
        FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
        FVar16._14_2_ = (short)(uVar10 >> 0x30);
        FVar16.frac = (ulong)((uint)uVar9 & 1) | uVar9 >> 1;
      }
      goto LAB_00cfd7d3;
    }
    if (((FVar17._12_4_ | uVar2) & 0xfc) != 0) {
LAB_00cfd5cb:
      FVar16 = pick_nan(FVar16,FVar17,status);
      goto LAB_00cfd7d3;
    }
    if ((FVar3 == float_class_inf) || (FVar4 == float_class_zero)) goto LAB_00cfd7d3;
    if ((FVar3 != float_class_zero) && (FVar4 != float_class_inf)) {
LAB_00cfd738:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                 ,0x428,(char *)0x0);
    }
    uVar10 = 0;
    if (FVar17.sign != subtract) {
      uVar10 = 0x10000000000;
    }
    uVar10 = uVar12 & 0xffff00ffffffffff | uVar10;
  }
  else {
    if (FVar4 == float_class_normal && FVar3 == float_class_normal) {
      if ((iVar11 < iVar8) || ((iVar8 == iVar11 && (uVar9 <= uVar10)))) {
        iVar8 = iVar8 - iVar11;
        if (iVar8 != 0) {
          if (iVar8 < 0x40) {
            uVar9 = (ulong)(uVar9 << (-(byte)iVar8 & 0x3f) != 0) | uVar9 >> ((byte)iVar8 & 0x3f);
          }
          else {
            uVar9 = (ulong)(uVar9 != 0);
          }
        }
        uVar10 = uVar10 - uVar9;
      }
      else {
        iVar11 = iVar11 - iVar8;
        if (iVar11 != 0) {
          if (iVar11 < 0x40) {
            uVar10 = (ulong)(uVar10 << (-(byte)iVar11 & 0x3f) != 0) |
                     uVar10 >> ((byte)iVar11 & 0x3f);
          }
          else {
            uVar10 = (ulong)(uVar10 != 0);
          }
        }
        uVar10 = uVar9 - uVar10;
        uVar15 = uVar15 & 0xffffffff00000000 | uVar12 & 0xffffffff;
        uVar13 = uVar2 >> 8 ^ 1;
      }
      if (uVar10 == 0) {
        uVar9 = uVar15 & 0xffffff00ffffffff | 0x100000000;
        uVar10 = (ulong)(status->float_rounding_mode == '\x01');
        uVar14 = 0;
      }
      else {
        lVar1 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        iVar8 = ((uint)lVar1 ^ 0x3f) - 1;
        uVar14 = uVar10 << ((byte)iVar8 & 0x3f);
        uVar9 = uVar15 & 0xffffffff00000000 | (ulong)(uint)((int)uVar15 - iVar8);
        uVar10 = (ulong)(uVar13 & 1);
      }
      uVar9 = uVar9 & 0xffff00ffffffffff | uVar10 << 0x28;
      FVar16.exp = (int)uVar9;
      FVar16.cls = (char)(uVar9 >> 0x20);
      FVar16.sign = (_Bool)(char)(uVar9 >> 0x28);
      FVar16._14_2_ = (short)(uVar9 >> 0x30);
      FVar16.frac = uVar14;
      goto LAB_00cfd7d3;
    }
    if (((FVar17._12_4_ | uVar2) & 0xfc) != 0) goto LAB_00cfd5cb;
    if (FVar3 == float_class_inf) {
      if (FVar4 == float_class_inf) {
        status->float_exception_flags = status->float_exception_flags | 1;
        FVar16.exp = 0x7fffffff;
        FVar16.cls = float_class_qnan;
        FVar16.sign = false;
        FVar16._14_2_ = 0;
        FVar16.frac = 0x2000000000000000;
      }
      goto LAB_00cfd7d3;
    }
    if ((FVar3 == float_class_zero) && (FVar4 == float_class_zero)) {
      uVar9 = 0;
      if (status->float_rounding_mode == '\x01') {
        uVar9 = 0x10000000000;
      }
      uVar9 = uVar15 & 0xffff00ffffffffff | uVar9;
      FVar16.exp = (int)uVar9;
      FVar16.cls = (char)(uVar9 >> 0x20);
      FVar16.sign = (_Bool)(char)(uVar9 >> 0x28);
      FVar16._14_2_ = (short)(uVar9 >> 0x30);
      FVar16.frac = uVar10;
      goto LAB_00cfd7d3;
    }
    if ((FVar3 != float_class_zero) && (FVar4 != float_class_inf)) {
      if (FVar4 != float_class_zero) goto LAB_00cfd738;
      goto LAB_00cfd7d3;
    }
    uVar10 = (uVar12 & 0xffff00ffffffffff | uVar15 & 0xff0000000000) ^ 0x10000000000;
  }
  FVar16.exp = (int)uVar10;
  FVar16.cls = (char)(uVar10 >> 0x20);
  FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
  FVar16._14_2_ = (short)(uVar10 >> 0x30);
  FVar16.frac = uVar9;
LAB_00cfd7d3:
  FVar16 = round_canonical(FVar16,status,&float64_params);
  return FVar16.frac & 0xfffffffffffff | (ulong)(FVar16.exp & 0x7ff) << 0x34 |
         (FVar16._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_addsub(float64 a, float64 b, bool subtract, float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pr = addsub_floats(pa, pb, subtract, status);

    return float64_round_pack_canonical(pr, status);
}